

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getLeaveVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *leaveMax,SPxId enterId,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterBound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newUBbound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newLBbound,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newCoPrhs,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  pointer pnVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int32_t iVar26;
  int iVar27;
  Status SVar28;
  long lVar29;
  Status *pSVar30;
  pointer pnVar31;
  ostream *poVar32;
  undefined8 *puVar33;
  long lVar34;
  cpp_dec_float<100U,_int,_void> *pcVar35;
  long lVar36;
  cpp_dec_float<100U,_int,_void> *pcVar37;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_148;
  cpp_dec_float<100U,_int,_void> local_f8;
  cpp_dec_float<100U,_int,_void> local_a8;
  DataKey local_50;
  double local_48;
  undefined8 uStack_40;
  
  this_00 = &this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_50 = enterId.super_DataKey;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&enterBound->m_backend,0);
  pcVar35 = &newCoPrhs->m_backend;
  if (-1 < local_50.info) {
    SPxColId::SPxColId((SPxColId *)&local_148,(SPxId *)&local_50);
    iVar27 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&local_148);
    lVar34 = (long)iVar27;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.colstat.data[lVar34]) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      local_48 = *(double *)(in_FS_OFFSET + -8);
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      uStack_40 = 0;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,local_48);
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_148.exp;
      (newUBbound->m_backend).neg = local_148.neg;
      (newUBbound->m_backend).fpclass = local_148.fpclass;
      (newUBbound->m_backend).prec_elem = local_148.prec_elem;
      ::soplex::infinity::__tls_init();
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,-local_48);
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
      (newLBbound->m_backend).exp = local_148.exp;
      (newLBbound->m_backend).neg = local_148.neg;
      (newLBbound->m_backend).fpclass = local_148.fpclass;
      (newLBbound->m_backend).prec_elem = local_148.prec_elem;
      pnVar31 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
      (newCoPrhs->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar26;
      pSVar30 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
      goto LAB_003a2c27;
    case D_ON_UPPER:
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newUBbound->m_backend,0);
      ::soplex::infinity::__tls_init();
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,-*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
      (newLBbound->m_backend).exp = local_148.exp;
      (newLBbound->m_backend).neg = local_148.neg;
      (newLBbound->m_backend).fpclass = local_148.fpclass;
      (newLBbound->m_backend).prec_elem = local_148.prec_elem;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar34] = P_ON_LOWER;
      pnVar31 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_003a1c17:
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
LAB_003a1f6e:
      (newCoPrhs->m_backend).exp = *(int *)((long)(pnVar31 + lVar34) + 0x40);
      (newCoPrhs->m_backend).neg = *(bool *)((long)(pnVar31 + lVar34) + 0x44);
      uVar13 = *(undefined8 *)((long)(pnVar31 + lVar34) + 0x48);
      (newCoPrhs->m_backend).fpclass = (int)uVar13;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
      return;
    case D_ON_LOWER:
      ::soplex::infinity::__tls_init();
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_148.exp;
      (newUBbound->m_backend).neg = local_148.neg;
      (newUBbound->m_backend).fpclass = local_148.fpclass;
      (newUBbound->m_backend).prec_elem = local_148.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar34] = P_ON_UPPER;
      pnVar31 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_003a1f35:
      uVar13 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar22 = *(undefined8 *)puVar1;
      uVar23 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar24 = *(undefined8 *)puVar1;
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems =
           *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar20;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
      goto LAB_003a1f6e;
    case D_ON_BOTH:
      pnVar31 = (this->theCoPvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar36 = lVar34 * 0x50;
      local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_f8.exp = pnVar31[lVar34].m_backend.exp;
      local_f8.neg = pnVar31[lVar34].m_backend.neg;
      local_f8.fpclass = pnVar31[lVar34].m_backend.fpclass;
      local_f8.prec_elem = pnVar31[lVar34].m_backend.prec_elem;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 0x10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[6] = 0;
      local_a8.data._M_elems[7] = 0;
      local_a8.data._M_elems[8] = 0;
      local_a8.data._M_elems[9] = 0;
      local_a8.data._M_elems[10] = 0;
      local_a8.data._M_elems[0xb] = 0;
      local_a8.data._M_elems[0xc] = 0;
      local_a8.data._M_elems[0xd] = 0;
      local_a8.data._M_elems._56_5_ = 0;
      local_a8.data._M_elems[0xf]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (&local_a8 != &leaveMax->m_backend) {
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(leaveMax->m_backend).data._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 4);
        local_a8.data._M_elems._24_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 6);
        local_a8.data._M_elems._32_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 8);
        local_a8.data._M_elems._40_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 10);
        local_a8.data._M_elems._48_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xc);
        uVar13 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xe);
        local_a8.data._M_elems._56_5_ = SUB85(uVar13,0);
        local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
        local_a8.exp = (leaveMax->m_backend).exp;
        local_a8.neg = (leaveMax->m_backend).neg;
        local_a8.fpclass = (leaveMax->m_backend).fpclass;
        local_a8.prec_elem = (leaveMax->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a8,&local_f8);
      if (local_a8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_148,0,(type *)0x0);
        iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_a8,&local_148);
        if (iVar27 < 0) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&newUBbound->m_backend,0);
          ::soplex::infinity::__tls_init();
          local_148.fpclass = cpp_dec_float_finite;
          local_148.prec_elem = 0x10;
          local_148.data._M_elems[0] = 0;
          local_148.data._M_elems[1] = 0;
          local_148.data._M_elems[2] = 0;
          local_148.data._M_elems[3] = 0;
          local_148.data._M_elems[4] = 0;
          local_148.data._M_elems[5] = 0;
          local_148.data._M_elems[6] = 0;
          local_148.data._M_elems[7] = 0;
          local_148.data._M_elems[8] = 0;
          local_148.data._M_elems[9] = 0;
          local_148.data._M_elems[10] = 0;
          local_148.data._M_elems[0xb] = 0;
          local_148.data._M_elems[0xc] = 0;
          local_148.data._M_elems[0xd] = 0;
          local_148.data._M_elems[0xe] = 0;
          local_148.data._M_elems[0xf] = 0;
          local_148.exp = 0;
          local_148.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_148,-*(double *)(in_FS_OFFSET + -8));
          *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_
          ;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) =
               local_148.data._M_elems._16_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) =
               local_148.data._M_elems._24_8_;
          *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) =
               local_148.data._M_elems._32_8_;
          *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
               CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
          *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
               CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
          *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
               CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
          (newLBbound->m_backend).exp = local_148.exp;
          (newLBbound->m_backend).neg = local_148.neg;
          (newLBbound->m_backend).fpclass = local_148.fpclass;
          (newLBbound->m_backend).prec_elem = local_148.prec_elem;
          (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.colstat.data[lVar34] = P_ON_LOWER;
          pnVar31 = (this->theLCbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_003a2dbd:
          puVar33 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36);
          uVar13 = *puVar33;
          uVar20 = puVar33[1];
          puVar33 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36 + 0x10);
          uVar21 = *puVar33;
          uVar22 = puVar33[1];
          puVar33 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36 + 0x20);
          uVar23 = *puVar33;
          uVar24 = puVar33[1];
          puVar33 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36 + 0x30);
          uVar25 = puVar33[1];
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *puVar33;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
          *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
          *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
          goto LAB_003a21ae;
        }
      }
      ::soplex::infinity::__tls_init();
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,*(double *)(in_FS_OFFSET + -8));
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
           CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
           CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
           CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
      (newUBbound->m_backend).exp = local_148.exp;
      (newUBbound->m_backend).neg = local_148.neg;
      (newUBbound->m_backend).fpclass = local_148.fpclass;
      (newUBbound->m_backend).prec_elem = local_148.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar34] = P_ON_UPPER;
      pnVar31 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_003a2180:
      puVar33 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36);
      uVar13 = puVar33[1];
      puVar3 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36 + 0x10);
      uVar20 = *puVar3;
      uVar21 = puVar3[1];
      puVar3 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36 + 0x20);
      uVar22 = *puVar3;
      uVar23 = puVar3[1];
      puVar3 = (undefined8 *)((long)&(pnVar31->m_backend).data + lVar36 + 0x30);
      uVar24 = *puVar3;
      uVar25 = puVar3[1];
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = *puVar33;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar20;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar22;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
LAB_003a21ae:
      (newCoPrhs->m_backend).exp = *(int *)((long)&(pnVar31->m_backend).data + lVar36 + 0x40);
      (newCoPrhs->m_backend).neg = *(bool *)((long)&(pnVar31->m_backend).data + lVar36 + 0x44);
      uVar13 = *(undefined8 *)((long)&(pnVar31->m_backend).data + lVar36 + 0x48);
      (newCoPrhs->m_backend).fpclass = (int)uVar13;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
      return;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE56 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ERROR! Tried to put a fixed column variable into the basis. ",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar32 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar32,", lower=",8);
      poVar32 = boost::multiprecision::operator<<
                          (poVar32,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .low.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar34);
      std::__ostream_insert<char,std::char_traits<char>>(poVar32,", upper=",8);
      poVar32 = boost::multiprecision::operator<<
                          (poVar32,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar34);
      std::endl<char,std::char_traits<char>>(poVar32);
      puVar33 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_148.data._M_elems._0_8_ = local_148.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"XLEAVE07 This should never happen.","");
      *puVar33 = &PTR__SPxException_006a9ee8;
      puVar33[1] = puVar33 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar33 + 1),local_148.data._M_elems._0_8_,
                 local_148.data._M_elems._0_8_ + local_148.data._M_elems._8_8_);
      *puVar33 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar33,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar33 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_148.data._M_elems._0_8_ = local_148.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"XLEAVE08 This should never happen.","");
      *puVar33 = &PTR__SPxException_006a9ee8;
      puVar33[1] = puVar33 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar33 + 1),local_148.data._M_elems._0_8_,
                 local_148.data._M_elems._0_8_ + local_148.data._M_elems._8_8_);
      *puVar33 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar33,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar28 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar27);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar34] = SVar28;
      pcVar37 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
      ::soplex::infinity::__tls_init();
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,*(double *)(in_FS_OFFSET + -8));
      if (((pcVar37->fpclass != cpp_dec_float_NaN) && (local_148.fpclass != cpp_dec_float_NaN)) &&
         (iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar37,&local_148), iVar27 < 0)) {
        pnVar31 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = (this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = *(undefined8 *)&pnVar12[lVar34].m_backend.data;
        uVar20 = *(undefined8 *)((long)&pnVar12[lVar34].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x10);
        uVar21 = *(undefined8 *)puVar1;
        uVar22 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x20);
        uVar23 = *(undefined8 *)puVar1;
        uVar24 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x30);
        uVar25 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar25;
        puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = uVar23;
        *(undefined8 *)(puVar1 + 2) = uVar24;
        puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar21;
        *(undefined8 *)(puVar1 + 2) = uVar22;
        *(undefined8 *)&pnVar31[lVar34].m_backend.data = uVar13;
        *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8) = uVar20;
        pnVar31[lVar34].m_backend.exp = pnVar12[lVar34].m_backend.exp;
        pnVar31[lVar34].m_backend.neg = pnVar12[lVar34].m_backend.neg;
        iVar26 = pnVar12[lVar34].m_backend.prec_elem;
        pnVar31[lVar34].m_backend.fpclass = pnVar12[lVar34].m_backend.fpclass;
        pnVar31[lVar34].m_backend.prec_elem = iVar26;
      }
      pnVar31 = (this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
      (newCoPrhs->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar26;
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar20;
      (newUBbound->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar26;
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar20;
      (newLBbound->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar26;
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      SVar28 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar27);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar34] = SVar28;
      pcVar37 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
      ::soplex::infinity::__tls_init();
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 0x10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems[6] = 0;
      local_148.data._M_elems[7] = 0;
      local_148.data._M_elems[8] = 0;
      local_148.data._M_elems[9] = 0;
      local_148.data._M_elems[10] = 0;
      local_148.data._M_elems[0xb] = 0;
      local_148.data._M_elems[0xc] = 0;
      local_148.data._M_elems[0xd] = 0;
      local_148.data._M_elems[0xe] = 0;
      local_148.data._M_elems[0xf] = 0;
      local_148.exp = 0;
      local_148.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_148,-*(double *)(in_FS_OFFSET + -8));
      if (((pcVar37->fpclass != cpp_dec_float_NaN) && (local_148.fpclass != cpp_dec_float_NaN)) &&
         (iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar37,&local_148), 0 < iVar27)) {
        pnVar31 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = (this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
        uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
        uVar21 = *(undefined8 *)puVar1;
        uVar22 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
        uVar23 = *(undefined8 *)puVar1;
        uVar24 = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
        uVar25 = *(undefined8 *)(puVar1 + 2);
        puVar2 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x30);
        *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
        *(undefined8 *)(puVar2 + 2) = uVar25;
        puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = uVar23;
        *(undefined8 *)(puVar1 + 2) = uVar24;
        puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar21;
        *(undefined8 *)(puVar1 + 2) = uVar22;
        *(undefined8 *)&pnVar12[lVar34].m_backend.data = uVar13;
        *(undefined8 *)((long)&pnVar12[lVar34].m_backend.data + 8) = uVar20;
        pnVar12[lVar34].m_backend.exp = pnVar31[lVar34].m_backend.exp;
        pnVar12[lVar34].m_backend.neg = pnVar31[lVar34].m_backend.neg;
        iVar26 = pnVar31[lVar34].m_backend.prec_elem;
        pnVar12[lVar34].m_backend.fpclass = pnVar31[lVar34].m_backend.fpclass;
        pnVar12[lVar34].m_backend.prec_elem = iVar26;
      }
      pnVar31 = (this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
      (newCoPrhs->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newCoPrhs->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newCoPrhs->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newCoPrhs->m_backend).prec_elem = iVar26;
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar20;
      (newUBbound->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar26;
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar20;
      (newLBbound->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar26;
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      SVar28 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar27);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar34] = SVar28;
      pnVar31 = (this->thePvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_f8.exp = pnVar31[lVar34].m_backend.exp;
      local_f8.neg = pnVar31[lVar34].m_backend.neg;
      local_f8.fpclass = pnVar31[lVar34].m_backend.fpclass;
      local_f8.prec_elem = pnVar31[lVar34].m_backend.prec_elem;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 0x10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[6] = 0;
      local_a8.data._M_elems[7] = 0;
      local_a8.data._M_elems[8] = 0;
      local_a8.data._M_elems[9] = 0;
      local_a8.data._M_elems[10] = 0;
      local_a8.data._M_elems[0xb] = 0;
      local_a8.data._M_elems[0xc] = 0;
      local_a8.data._M_elems[0xd] = 0;
      local_a8.data._M_elems._56_5_ = 0;
      local_a8.data._M_elems[0xf]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (&local_a8 == &leaveMax->m_backend) {
        leaveMax = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_f8;
      }
      else {
        local_a8.data._M_elems._56_5_ = local_f8.data._M_elems._56_5_;
        local_a8.data._M_elems[0xf]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
        local_a8.prec_elem = local_f8.prec_elem;
        local_a8.fpclass = local_f8.fpclass;
        local_a8.data._M_elems._0_8_ = local_f8.data._M_elems._0_8_;
        local_a8.data._M_elems._8_8_ = local_f8.data._M_elems._8_8_;
        local_a8.data._M_elems._16_8_ = local_f8.data._M_elems._16_8_;
        local_a8.data._M_elems._24_8_ = local_f8.data._M_elems._24_8_;
        local_a8.data._M_elems._32_8_ = local_f8.data._M_elems._32_8_;
        local_a8.data._M_elems._40_8_ = local_f8.data._M_elems._40_8_;
        local_a8.data._M_elems._48_8_ = local_f8.data._M_elems._48_8_;
        local_a8.exp = local_f8.exp;
        local_a8.neg = local_f8.neg;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_a8,&leaveMax->m_backend);
      if (local_a8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_148,0,(type *)0x0);
        iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_a8,&local_148);
        lVar36 = 0xbc0;
        if (0 < iVar27) goto LAB_003a24ef;
      }
      lVar36 = 0xbd8;
LAB_003a24ef:
      lVar36 = *(long *)((long)&(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray + lVar36);
      lVar29 = lVar34 * 0x50;
      uVar13 = *(undefined8 *)(lVar36 + lVar29);
      uVar20 = ((undefined8 *)(lVar36 + lVar29))[1];
      puVar33 = (undefined8 *)(lVar36 + 0x10 + lVar29);
      uVar21 = *puVar33;
      uVar22 = puVar33[1];
      puVar33 = (undefined8 *)(lVar36 + 0x20 + lVar29);
      uVar23 = *puVar33;
      uVar24 = puVar33[1];
      puVar33 = (undefined8 *)(lVar36 + 0x30 + lVar29);
      uVar25 = puVar33[1];
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *puVar33;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
      (newCoPrhs->m_backend).exp = *(int *)(lVar36 + 0x40 + lVar29);
      (newCoPrhs->m_backend).neg = *(bool *)(lVar36 + 0x44 + lVar29);
      uVar13 = *(undefined8 *)(lVar36 + 0x48 + lVar29);
      (newCoPrhs->m_backend).fpclass = (int)uVar13;
      (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = uVar20;
      (newUBbound->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newUBbound->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newUBbound->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = iVar26;
      pnVar31 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar25;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = uVar23;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 10) = uVar24;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = uVar21;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = uVar22;
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = uVar13;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = uVar20;
      (newLBbound->m_backend).exp = pnVar31[lVar34].m_backend.exp;
      (newLBbound->m_backend).neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      (newLBbound->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = iVar26;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&enterBound->m_backend,0);
      return;
    }
    uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
    uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
    uVar21 = *(undefined8 *)puVar1;
    uVar22 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
    uVar23 = *(undefined8 *)puVar1;
    uVar24 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar25 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xe) = uVar25;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 8) = uVar23;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 10) = uVar24;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 4) = uVar21;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(enterBound->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 2) = uVar20;
    (enterBound->m_backend).exp = pnVar31[lVar34].m_backend.exp;
    (enterBound->m_backend).neg = pnVar31[lVar34].m_backend.neg;
    iVar26 = pnVar31[lVar34].m_backend.prec_elem;
    (enterBound->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
    (enterBound->m_backend).prec_elem = iVar26;
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    if ((&local_148 != &enterBound->m_backend) &&
       (pcVar35 = &enterBound->m_backend, &local_148 != &newCoPrhs->m_backend)) {
      local_148.data._M_elems._0_8_ = *(undefined8 *)(newCoPrhs->m_backend).data._M_elems;
      local_148.data._M_elems._8_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2);
      local_148.data._M_elems._16_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4);
      local_148.data._M_elems._24_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6);
      local_148.data._M_elems._32_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8);
      uVar13 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10);
      uVar20 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc);
      uVar21 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe);
      local_148.data._M_elems[0xc] = (uint)uVar20;
      local_148.data._M_elems[0xd] = (uint)((ulong)uVar20 >> 0x20);
      local_148.data._M_elems[0xe] = (uint)uVar21;
      local_148.data._M_elems[0xf] = (uint)((ulong)uVar21 >> 0x20);
      local_148.data._M_elems[10] = (uint)uVar13;
      local_148.data._M_elems[0xb] = (uint)((ulong)uVar13 >> 0x20);
      local_148.exp = (newCoPrhs->m_backend).exp;
      local_148.neg = (newCoPrhs->m_backend).neg;
      local_148.fpclass = (newCoPrhs->m_backend).fpclass;
      local_148.prec_elem = (newCoPrhs->m_backend).prec_elem;
      pcVar35 = &enterBound->m_backend;
    }
    goto LAB_003a2a3b;
  }
  SPxRowId::SPxRowId((SPxRowId *)&local_148,(SPxId *)&local_50);
  iVar27 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
           ::number(&(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set,(DataKey *)&local_148);
  lVar34 = (long)iVar27;
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.rowstat.data[lVar34]) {
  case D_FREE:
    pnVar31 = (this->thePvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar36 = lVar34 * 0x50;
    local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
    local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
    local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
    local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_f8.exp = pnVar31[lVar34].m_backend.exp;
    local_f8.neg = pnVar31[lVar34].m_backend.neg;
    local_f8.fpclass = pnVar31[lVar34].m_backend.fpclass;
    local_f8.prec_elem = pnVar31[lVar34].m_backend.prec_elem;
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 0x10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems[6] = 0;
    local_a8.data._M_elems[7] = 0;
    local_a8.data._M_elems[8] = 0;
    local_a8.data._M_elems[9] = 0;
    local_a8.data._M_elems[10] = 0;
    local_a8.data._M_elems[0xb] = 0;
    local_a8.data._M_elems[0xc] = 0;
    local_a8.data._M_elems[0xd] = 0;
    local_a8.data._M_elems._56_5_ = 0;
    local_a8.data._M_elems[0xf]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    if (&local_a8 == &leaveMax->m_backend) {
      leaveMax = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_f8;
    }
    else {
      local_a8.data._M_elems._56_5_ = local_f8.data._M_elems._56_5_;
      local_a8.data._M_elems[0xf]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
      local_a8.prec_elem = local_f8.prec_elem;
      local_a8.fpclass = local_f8.fpclass;
      local_a8.data._M_elems._0_8_ = local_f8.data._M_elems._0_8_;
      local_a8.data._M_elems._8_8_ = local_f8.data._M_elems._8_8_;
      local_a8.data._M_elems._16_8_ = local_f8.data._M_elems._16_8_;
      local_a8.data._M_elems._24_8_ = local_f8.data._M_elems._24_8_;
      local_a8.data._M_elems._32_8_ = local_f8.data._M_elems._32_8_;
      local_a8.data._M_elems._40_8_ = local_f8.data._M_elems._40_8_;
      local_a8.data._M_elems._48_8_ = local_f8.data._M_elems._48_8_;
      local_a8.exp = local_f8.exp;
      local_a8.neg = local_f8.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
              (&local_a8,&leaveMax->m_backend);
    if (local_a8.fpclass == cpp_dec_float_NaN) {
LAB_003a2abe:
      lVar29 = 0xb90;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_148,0,(type *)0x0);
      iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_a8,&local_148);
      if (-1 < iVar27) goto LAB_003a2abe;
      lVar29 = 0xba8;
    }
    lVar29 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar29);
    uVar13 = *(undefined8 *)(lVar29 + lVar36);
    uVar20 = ((undefined8 *)(lVar29 + lVar36))[1];
    puVar33 = (undefined8 *)(lVar29 + 0x10 + lVar36);
    uVar21 = *puVar33;
    uVar22 = puVar33[1];
    puVar33 = (undefined8 *)(lVar29 + 0x20 + lVar36);
    uVar23 = *puVar33;
    uVar24 = puVar33[1];
    puVar33 = (undefined8 *)(lVar29 + 0x30 + lVar36);
    uVar25 = puVar33[1];
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *puVar33;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
    (newCoPrhs->m_backend).exp = *(int *)(lVar29 + 0x40 + lVar36);
    (newCoPrhs->m_backend).neg = *(bool *)(lVar29 + 0x44 + lVar36);
    uVar13 = *(undefined8 *)(lVar29 + 0x48 + lVar36);
    (newCoPrhs->m_backend).fpclass = (int)uVar13;
    (newCoPrhs->m_backend).prec_elem = (int)((ulong)uVar13 >> 0x20);
    ::soplex::infinity::__tls_init();
    local_48 = *(double *)(in_FS_OFFSET + -8);
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    uStack_40 = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_148,local_48);
    *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
         CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
         CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
    (newUBbound->m_backend).exp = local_148.exp;
    (newUBbound->m_backend).neg = local_148.neg;
    (newUBbound->m_backend).fpclass = local_148.fpclass;
    (newUBbound->m_backend).prec_elem = local_148.prec_elem;
    ::soplex::infinity::__tls_init();
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_148,-local_48);
    *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
    *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
         CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
    *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
    *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
         CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
    (newLBbound->m_backend).exp = local_148.exp;
    (newLBbound->m_backend).neg = local_148.neg;
    (newLBbound->m_backend).fpclass = local_148.fpclass;
    (newLBbound->m_backend).prec_elem = local_148.prec_elem;
    pSVar30 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data;
LAB_003a2c27:
    pSVar30[lVar34] = P_FIXED;
    return;
  case D_ON_UPPER:
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&newUBbound->m_backend,0);
    ::soplex::infinity::__tls_init();
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_148,-*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
    *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
         CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
    *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
    *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
         CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
    (newLBbound->m_backend).exp = local_148.exp;
    (newLBbound->m_backend).neg = local_148.neg;
    (newLBbound->m_backend).fpclass = local_148.fpclass;
    (newLBbound->m_backend).prec_elem = local_148.prec_elem;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar34] = P_ON_LOWER;
    pnVar31 = (this->theLRbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_003a1c17;
  case D_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_148,*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
         CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
         CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
    (newUBbound->m_backend).exp = local_148.exp;
    (newUBbound->m_backend).neg = local_148.neg;
    (newUBbound->m_backend).fpclass = local_148.fpclass;
    (newUBbound->m_backend).prec_elem = local_148.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&newLBbound->m_backend,0);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar34] = P_ON_UPPER;
    pnVar31 = (this->theURbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_003a1f35;
  case D_ON_BOTH:
    pnVar31 = (this->thePvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar36 = lVar34 * 0x50;
    local_f8.data._M_elems._0_8_ = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
    local_f8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
    local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
    local_f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    local_f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_f8.exp = pnVar31[lVar34].m_backend.exp;
    local_f8.neg = pnVar31[lVar34].m_backend.neg;
    local_f8.fpclass = pnVar31[lVar34].m_backend.fpclass;
    local_f8.prec_elem = pnVar31[lVar34].m_backend.prec_elem;
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 0x10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems[6] = 0;
    local_a8.data._M_elems[7] = 0;
    local_a8.data._M_elems[8] = 0;
    local_a8.data._M_elems[9] = 0;
    local_a8.data._M_elems[10] = 0;
    local_a8.data._M_elems[0xb] = 0;
    local_a8.data._M_elems[0xc] = 0;
    local_a8.data._M_elems[0xd] = 0;
    local_a8.data._M_elems._56_5_ = 0;
    local_a8.data._M_elems[0xf]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    if (&local_a8 != &leaveMax->m_backend) {
      local_a8.data._M_elems._0_8_ = *(undefined8 *)(leaveMax->m_backend).data._M_elems;
      local_a8.data._M_elems._8_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 2);
      local_a8.data._M_elems._16_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 4);
      local_a8.data._M_elems._24_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 6);
      local_a8.data._M_elems._32_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 8);
      local_a8.data._M_elems._40_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 10);
      local_a8.data._M_elems._48_8_ = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xc);
      uVar13 = *(undefined8 *)((leaveMax->m_backend).data._M_elems + 0xe);
      local_a8.data._M_elems._56_5_ = SUB85(uVar13,0);
      local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar13 >> 0x28);
      local_a8.exp = (leaveMax->m_backend).exp;
      local_a8.neg = (leaveMax->m_backend).neg;
      local_a8.fpclass = (leaveMax->m_backend).fpclass;
      local_a8.prec_elem = (leaveMax->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_a8,&local_f8)
    ;
    if (local_a8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_148,0,(type *)0x0);
      iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_a8,&local_148);
      if (iVar27 < 0) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&newUBbound->m_backend,0);
        ::soplex::infinity::__tls_init();
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 0x10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems[6] = 0;
        local_148.data._M_elems[7] = 0;
        local_148.data._M_elems[8] = 0;
        local_148.data._M_elems[9] = 0;
        local_148.data._M_elems[10] = 0;
        local_148.data._M_elems[0xb] = 0;
        local_148.data._M_elems[0xc] = 0;
        local_148.data._M_elems[0xd] = 0;
        local_148.data._M_elems[0xe] = 0;
        local_148.data._M_elems[0xf] = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_148,-*(double *)(in_FS_OFFSET + -8));
        *(undefined8 *)(newLBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
        *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
        *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
        *(undefined8 *)((newLBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
        *(undefined8 *)((newLBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
        *(ulong *)((newLBbound->m_backend).data._M_elems + 10) =
             CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
        *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
             CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
        *(ulong *)((newLBbound->m_backend).data._M_elems + 0xe) =
             CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
        (newLBbound->m_backend).exp = local_148.exp;
        (newLBbound->m_backend).neg = local_148.neg;
        (newLBbound->m_backend).fpclass = local_148.fpclass;
        (newLBbound->m_backend).prec_elem = local_148.prec_elem;
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.rowstat.data[lVar34] = P_ON_LOWER;
        pnVar31 = (this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_003a2dbd;
      }
    }
    ::soplex::infinity::__tls_init();
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_148,*(double *)(in_FS_OFFSET + -8));
    *(undefined8 *)(newUBbound->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) = local_148.data._M_elems._8_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) = local_148.data._M_elems._16_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 6) = local_148.data._M_elems._24_8_;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 8) = local_148.data._M_elems._32_8_;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 10) =
         CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xe) =
         CONCAT44(local_148.data._M_elems[0xf],local_148.data._M_elems[0xe]);
    (newUBbound->m_backend).exp = local_148.exp;
    (newUBbound->m_backend).neg = local_148.neg;
    (newUBbound->m_backend).fpclass = local_148.fpclass;
    (newUBbound->m_backend).prec_elem = local_148.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&newLBbound->m_backend,0);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar34] = P_ON_UPPER;
    pnVar31 = (this->theURbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_003a2180;
  case P_FIXED:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE54 ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR! Tried to put a fixed row variable into the basis: ",
               0x39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
    poVar32 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar32,", lhs=",6);
    poVar32 = boost::multiprecision::operator<<
                        (poVar32,(this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .left.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar32,", rhs=",6);
    poVar32 = boost::multiprecision::operator<<
                        (poVar32,(this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .right.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar34);
    std::endl<char,std::char_traits<char>>(poVar32);
    puVar33 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_148.data._M_elems._0_8_ = local_148.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"XLEAVE05 This should never happen.","");
    *puVar33 = &PTR__SPxException_006a9ee8;
    puVar33[1] = puVar33 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar33 + 1),local_148.data._M_elems._0_8_,
               local_148.data._M_elems._0_8_ + local_148.data._M_elems._8_8_);
    *puVar33 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar33,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  default:
    puVar33 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_148.data._M_elems._0_8_ = local_148.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"XLEAVE06 This should never happen.","");
    *puVar33 = &PTR__SPxException_006a9ee8;
    puVar33[1] = puVar33 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar33 + 1),local_148.data._M_elems._0_8_,
               local_148.data._M_elems._0_8_ + local_148.data._M_elems._8_8_);
    *puVar33 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar33,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    SVar28 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(this_00,iVar27);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar34] = SVar28;
    pcVar37 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
    ::soplex::infinity::__tls_init();
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_148,*(double *)(in_FS_OFFSET + -8));
    if (((pcVar37->fpclass != cpp_dec_float_NaN) && (local_148.fpclass != cpp_dec_float_NaN)) &&
       (iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (pcVar37,&local_148), iVar27 < 0)) {
      pnVar31 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x30);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar25;
      puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar23;
      *(undefined8 *)(puVar1 + 2) = uVar24;
      puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar21;
      *(undefined8 *)(puVar1 + 2) = uVar22;
      *(undefined8 *)&pnVar12[lVar34].m_backend.data = uVar13;
      *(undefined8 *)((long)&pnVar12[lVar34].m_backend.data + 8) = uVar20;
      pnVar12[lVar34].m_backend.exp = pnVar31[lVar34].m_backend.exp;
      pnVar12[lVar34].m_backend.neg = pnVar31[lVar34].m_backend.neg;
      iVar26 = pnVar31[lVar34].m_backend.prec_elem;
      pnVar12[lVar34].m_backend.fpclass = pnVar31[lVar34].m_backend.fpclass;
      pnVar12[lVar34].m_backend.prec_elem = iVar26;
    }
    pnVar31 = (this->theURbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
    uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
    uVar21 = *(undefined8 *)puVar1;
    uVar22 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
    uVar23 = *(undefined8 *)puVar1;
    uVar24 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar25 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
    (newCoPrhs->m_backend).exp = pnVar31[lVar34].m_backend.exp;
    (newCoPrhs->m_backend).neg = pnVar31[lVar34].m_backend.neg;
    iVar26 = pnVar31[lVar34].m_backend.prec_elem;
    (newCoPrhs->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
    (newCoPrhs->m_backend).prec_elem = iVar26;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar31[lVar34].m_backend.data._M_elems[0];
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x24);
    uVar20 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xb] = (uint)((ulong)uVar21 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x14);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 4);
    uVar24 = *(undefined8 *)puVar1;
    uVar25 = *(undefined8 *)(puVar1 + 2);
    iVar27 = pnVar31[lVar34].m_backend.exp;
    uVar9 = pnVar31[lVar34].m_backend.fpclass;
    uVar17 = pnVar31[lVar34].m_backend.prec_elem;
    bVar4 = pnVar31[lVar34].m_backend.neg;
    (newLBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar24;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar25;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar22;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar23;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 9) = uVar20;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xb) = uVar21;
    *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar13;
    (newLBbound->m_backend).exp = iVar27;
    (newLBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar9 != 0) ^ bVar4);
    (newLBbound->m_backend).fpclass = uVar9;
    (newLBbound->m_backend).prec_elem = uVar17;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar31[lVar34].m_backend.data._M_elems[0];
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x24);
    uVar20 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xb] = (uint)((ulong)uVar21 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x14);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 4);
    uVar24 = *(undefined8 *)puVar1;
    uVar25 = *(undefined8 *)(puVar1 + 2);
    uVar10 = pnVar31[lVar34].m_backend.fpclass;
    uVar18 = pnVar31[lVar34].m_backend.prec_elem;
    bVar4 = pnVar31[lVar34].m_backend.neg;
    iVar27 = pnVar31[lVar34].m_backend.exp;
    (newUBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar24;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar25;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar22;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar23;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 9) = uVar20;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xb) = uVar21;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar13;
    (newUBbound->m_backend).exp = iVar27;
    (newUBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar10 != 0) ^ bVar4);
    (newUBbound->m_backend).fpclass = uVar10;
    (newUBbound->m_backend).prec_elem = uVar18;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar31[lVar34].m_backend.data._M_elems[0];
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x24);
    uVar20 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xb] = (uint)((ulong)uVar21 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x14);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 4);
    uVar24 = *(undefined8 *)puVar1;
    uVar25 = *(undefined8 *)(puVar1 + 2);
    iVar27 = pnVar31[lVar34].m_backend.exp;
    uVar11 = pnVar31[lVar34].m_backend.fpclass;
    uVar19 = pnVar31[lVar34].m_backend.prec_elem;
    bVar4 = pnVar31[lVar34].m_backend.neg;
    (enterBound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar24;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar25;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar22;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar23;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 9) = uVar20;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xb) = uVar21;
    *(ulong *)((enterBound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xe) = uVar13;
    (enterBound->m_backend).exp = iVar27;
    (enterBound->m_backend).neg = (bool)((uVar5 != 0 || uVar11 != 0) ^ bVar4);
    (enterBound->m_backend).fpclass = uVar11;
    (enterBound->m_backend).prec_elem = uVar19;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_ON_UPPER:
    SVar28 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(this_00,iVar27);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar34] = SVar28;
    pcVar37 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
    ::soplex::infinity::__tls_init();
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems[0xe] = 0;
    local_148.data._M_elems[0xf] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_148,-*(double *)(in_FS_OFFSET + -8));
    if (((pcVar37->fpclass != cpp_dec_float_NaN) && (local_148.fpclass != cpp_dec_float_NaN)) &&
       (iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (pcVar37,&local_148), 0 < iVar27)) {
      pnVar31 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = *(undefined8 *)&pnVar12[lVar34].m_backend.data;
      uVar20 = *(undefined8 *)((long)&pnVar12[lVar34].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x10);
      uVar21 = *(undefined8 *)puVar1;
      uVar22 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x20);
      uVar23 = *(undefined8 *)puVar1;
      uVar24 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar12[lVar34].m_backend.data + 0x30);
      uVar25 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar25;
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = uVar23;
      *(undefined8 *)(puVar1 + 2) = uVar24;
      puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar21;
      *(undefined8 *)(puVar1 + 2) = uVar22;
      *(undefined8 *)&pnVar31[lVar34].m_backend.data = uVar13;
      *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8) = uVar20;
      pnVar31[lVar34].m_backend.exp = pnVar12[lVar34].m_backend.exp;
      pnVar31[lVar34].m_backend.neg = pnVar12[lVar34].m_backend.neg;
      iVar26 = pnVar12[lVar34].m_backend.prec_elem;
      pnVar31[lVar34].m_backend.fpclass = pnVar12[lVar34].m_backend.fpclass;
      pnVar31[lVar34].m_backend.prec_elem = iVar26;
    }
    pnVar31 = (this->theLRbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = *(undefined8 *)&pnVar31[lVar34].m_backend.data;
    uVar20 = *(undefined8 *)((long)&pnVar31[lVar34].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x10);
    uVar21 = *(undefined8 *)puVar1;
    uVar22 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x20);
    uVar23 = *(undefined8 *)puVar1;
    uVar24 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar25 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc) = *(undefined8 *)puVar1;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe) = uVar25;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8) = uVar23;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10) = uVar24;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4) = uVar21;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6) = uVar22;
    *(undefined8 *)(newCoPrhs->m_backend).data._M_elems = uVar13;
    *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2) = uVar20;
    (newCoPrhs->m_backend).exp = pnVar31[lVar34].m_backend.exp;
    (newCoPrhs->m_backend).neg = pnVar31[lVar34].m_backend.neg;
    iVar26 = pnVar31[lVar34].m_backend.prec_elem;
    (newCoPrhs->m_backend).fpclass = pnVar31[lVar34].m_backend.fpclass;
    (newCoPrhs->m_backend).prec_elem = iVar26;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar31[lVar34].m_backend.data._M_elems[0];
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x24);
    uVar20 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xb] = (uint)((ulong)uVar21 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x14);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 4);
    uVar24 = *(undefined8 *)puVar1;
    uVar25 = *(undefined8 *)(puVar1 + 2);
    iVar27 = pnVar31[lVar34].m_backend.exp;
    uVar6 = pnVar31[lVar34].m_backend.fpclass;
    uVar14 = pnVar31[lVar34].m_backend.prec_elem;
    bVar4 = pnVar31[lVar34].m_backend.neg;
    (newUBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar24;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar25;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar22;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar23;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 9) = uVar20;
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xb) = uVar21;
    *(ulong *)((newUBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
    *(undefined8 *)((newUBbound->m_backend).data._M_elems + 0xe) = uVar13;
    (newUBbound->m_backend).exp = iVar27;
    (newUBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar6 != 0) ^ bVar4);
    (newUBbound->m_backend).fpclass = uVar6;
    (newUBbound->m_backend).prec_elem = uVar14;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar31[lVar34].m_backend.data._M_elems[0];
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x24);
    uVar20 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xb] = (uint)((ulong)uVar21 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x14);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 4);
    uVar24 = *(undefined8 *)puVar1;
    uVar25 = *(undefined8 *)(puVar1 + 2);
    uVar7 = pnVar31[lVar34].m_backend.fpclass;
    uVar15 = pnVar31[lVar34].m_backend.prec_elem;
    bVar4 = pnVar31[lVar34].m_backend.neg;
    iVar27 = pnVar31[lVar34].m_backend.exp;
    (newLBbound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar24;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar25;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar22;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar23;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 9) = uVar20;
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xb) = uVar21;
    *(ulong *)((newLBbound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
    *(undefined8 *)((newLBbound->m_backend).data._M_elems + 0xe) = uVar13;
    (newLBbound->m_backend).exp = iVar27;
    (newLBbound->m_backend).neg = (bool)((uVar5 != 0 || uVar7 != 0) ^ bVar4);
    (newLBbound->m_backend).fpclass = uVar7;
    (newLBbound->m_backend).prec_elem = uVar15;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = pnVar31[lVar34].m_backend.data._M_elems[0];
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x30);
    uVar13 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x24);
    uVar20 = *(undefined8 *)puVar1;
    uVar21 = *(undefined8 *)(puVar1 + 2);
    local_148.data._M_elems[0xb] = (uint)((ulong)uVar21 >> 0x20);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 0x14);
    uVar22 = *(undefined8 *)puVar1;
    uVar23 = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)&pnVar31[lVar34].m_backend.data + 4);
    uVar24 = *(undefined8 *)puVar1;
    uVar25 = *(undefined8 *)(puVar1 + 2);
    iVar27 = pnVar31[lVar34].m_backend.exp;
    uVar8 = pnVar31[lVar34].m_backend.fpclass;
    uVar16 = pnVar31[lVar34].m_backend.prec_elem;
    bVar4 = pnVar31[lVar34].m_backend.neg;
    (enterBound->m_backend).data._M_elems[0] = uVar5;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar24;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar25;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar22;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar23;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 9) = uVar20;
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xb) = uVar21;
    *(ulong *)((enterBound->m_backend).data._M_elems + 0xc) =
         CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
    *(undefined8 *)((enterBound->m_backend).data._M_elems + 0xe) = uVar13;
    (enterBound->m_backend).exp = iVar27;
    (enterBound->m_backend).neg = (bool)((uVar5 != 0 || uVar8 != 0) ^ bVar4);
    (enterBound->m_backend).fpclass = uVar8;
    (enterBound->m_backend).prec_elem = uVar16;
    pnVar31 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_FREE:
    puVar33 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_148.data._M_elems._0_8_ = local_148.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"XLEAVE04 This should never happen.","");
    *puVar33 = &PTR__SPxException_006a9ee8;
    puVar33[1] = puVar33 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar33 + 1),local_148.data._M_elems._0_8_,
               local_148.data._M_elems._0_8_ + local_148.data._M_elems._8_8_);
    *puVar33 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar33,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  pcVar37 = (cpp_dec_float<100U,_int,_void> *)((long)pnVar31 + lVar34 * 0x50);
  local_148.fpclass = cpp_dec_float_finite;
  local_148.prec_elem = 0x10;
  local_148.data._M_elems[0] = 0;
  local_148.data._M_elems[1] = 0;
  local_148.data._M_elems[2] = 0;
  local_148.data._M_elems[3] = 0;
  local_148.data._M_elems[4] = 0;
  local_148.data._M_elems[5] = 0;
  local_148.data._M_elems[6] = 0;
  local_148.data._M_elems[7] = 0;
  local_148.data._M_elems[8] = 0;
  local_148.data._M_elems[9] = 0;
  local_148.data._M_elems[10] = 0;
  local_148.data._M_elems[0xb] = 0;
  local_148.data._M_elems[0xc] = 0;
  local_148.data._M_elems[0xd] = 0;
  local_148.data._M_elems[0xe] = 0;
  local_148.data._M_elems[0xf] = 0;
  local_148.exp = 0;
  local_148.neg = false;
  if ((&local_148 != pcVar37) && (pcVar35 = pcVar37, &local_148 != &newCoPrhs->m_backend)) {
    local_148.data._M_elems._0_8_ = *(undefined8 *)(newCoPrhs->m_backend).data._M_elems;
    local_148.data._M_elems._8_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 2);
    local_148.data._M_elems._16_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 4);
    local_148.data._M_elems._24_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 6);
    local_148.data._M_elems._32_8_ = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 8);
    uVar13 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 10);
    uVar20 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xc);
    uVar21 = *(undefined8 *)((newCoPrhs->m_backend).data._M_elems + 0xe);
    local_148.data._M_elems[0xc] = (uint)uVar20;
    local_148.data._M_elems[0xd] = (uint)((ulong)uVar20 >> 0x20);
    local_148.data._M_elems[0xe] = (uint)uVar21;
    local_148.data._M_elems[0xf] = (uint)((ulong)uVar21 >> 0x20);
    local_148.data._M_elems[10] = (uint)uVar13;
    local_148.data._M_elems[0xb] = (uint)((ulong)uVar13 >> 0x20);
    local_148.exp = (newCoPrhs->m_backend).exp;
    local_148.neg = (newCoPrhs->m_backend).neg;
    local_148.fpclass = (newCoPrhs->m_backend).fpclass;
    local_148.prec_elem = (newCoPrhs->m_backend).prec_elem;
  }
LAB_003a2a3b:
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_148,pcVar35);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
            ((cpp_dec_float<100U,_int,_void> *)objChange,&local_148);
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}